

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

normal3f tinyusdz::vnormalize(normal3f *a,float eps)

{
  normal3f nVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_3c;
  float len;
  float eps_local;
  normal3f *a_local;
  
  fVar2 = vlength(a);
  local_3c = eps;
  if (eps < fVar2) {
    local_3c = fVar2;
  }
  fVar2 = value::normal3f::operator[](a,0);
  fVar3 = value::normal3f::operator[](a,1);
  fVar4 = value::normal3f::operator[](a,2);
  nVar1.y = fVar3 / local_3c;
  nVar1.x = fVar2 / local_3c;
  nVar1.z = fVar4 / local_3c;
  return nVar1;
}

Assistant:

value::normal3f vnormalize(const value::normal3f &a, const float eps) {
  float len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::normal3f({a[0] / len, a[1] / len, a[2] / len});
}